

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_matrix.cpp
# Opt level: O0

Reals Omega_h::repeat_symm<2>(LO n,Tensor<2> symm)

{
  Vector<3> v_00;
  undefined4 in_register_0000003c;
  Reals RVar1;
  Reals RVar2;
  undefined8 local_e0;
  Vector<3> v;
  LO n_local;
  double local_b8;
  double local_b0;
  double local_a8;
  double local_a0;
  undefined4 local_94;
  undefined8 *local_90;
  undefined4 local_84;
  undefined8 *local_80;
  undefined4 local_74;
  undefined8 *local_70;
  undefined4 local_64;
  double *local_60;
  undefined4 local_54;
  double *local_50;
  undefined4 local_44;
  double *local_40;
  undefined4 local_34;
  double *local_30;
  undefined4 local_24;
  double *local_20;
  undefined4 local_14;
  double *local_10;
  
  RVar2.write_.shared_alloc_.alloc._4_4_ = in_register_0000003c;
  RVar2.write_.shared_alloc_.alloc._0_4_ = n;
  local_b8 = symm.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.array_[0];
  local_b0 = symm.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.array_[1];
  local_a8 = symm.super_Few<Omega_h::Vector<2>,_2>.array_[1].super_Few<double,_2>.array_[0];
  local_a0 = symm.super_Few<Omega_h::Vector<2>,_2>.array_[1].super_Few<double,_2>.array_[1];
  local_40 = &local_b8;
  local_44 = 0;
  local_14 = 0;
  local_70 = &local_e0;
  local_74 = 0;
  local_50 = &local_b8;
  local_54 = 1;
  local_20 = &local_a8;
  local_24 = 1;
  local_80 = &local_e0;
  local_84 = 1;
  local_60 = &local_b8;
  local_64 = 1;
  local_30 = &local_a8;
  local_34 = 0;
  local_90 = &local_e0;
  local_94 = 2;
  v_00.super_Few<double,_3>.array_[1] = v.super_Few<double,_3>.array_[0];
  v_00.super_Few<double,_3>.array_[0] = (double)local_e0;
  v_00.super_Few<double,_3>.array_[2] = v.super_Few<double,_3>.array_[1];
  local_10 = local_40;
  RVar1 = repeat_vector<3>(n,v_00);
  RVar2.write_.shared_alloc_.direct_ptr = RVar1.write_.shared_alloc_.direct_ptr;
  return (Reals)RVar2.write_.shared_alloc_;
}

Assistant:

Reals repeat_symm(LO const n, Tensor<dim> const symm) {
  return repeat_vector(n, symm2vector(symm));
}